

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O1

void __thiscall
enact::ParametricTypename::ParametricTypename
          (ParametricTypename *this,ParametricTypename *typename_)

{
  pointer puVar1;
  pointer *__ptr;
  pointer puVar2;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_68;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_60;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_58;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_50;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  local_48;
  
  (*((typename_->m_constructorTypename)._M_t.
     super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
     super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
     super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename[2])
            (&local_50);
  local_68._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Typename *)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (typename_->m_parameterTypenames).
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (typename_->m_parameterTypenames).
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar2 != puVar1) {
    do {
      (*((puVar2->_M_t).
         super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>.
         _M_t.
         super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
         .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename[2])
                (&local_58);
      local_60._M_head_impl = local_58._M_head_impl;
      local_58._M_head_impl = (Typename *)0x0;
      std::
      vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
      ::
      emplace_back<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
                ((vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
                  *)&local_48,
                 (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
                 &local_60);
      if (local_60._M_head_impl != (Typename *)0x0) {
        (*(local_60._M_head_impl)->_vptr_Typename[1])();
      }
      local_60._M_head_impl = (Typename *)0x0;
      if (local_58._M_head_impl != (Typename *)0x0) {
        (*(local_58._M_head_impl)->_vptr_Typename[1])();
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  ParametricTypename(this,(unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                           *)&local_68,&local_48);
  std::
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ::~vector(&local_48);
  if (local_68._M_head_impl != (Typename *)0x0) {
    (*(local_68._M_head_impl)->_vptr_Typename[1])();
  }
  local_68._M_head_impl = (Typename *)0x0;
  if (local_50._M_head_impl != (Typename *)0x0) {
    (*(local_50._M_head_impl)->_vptr_Typename[1])();
  }
  return;
}

Assistant:

ParametricTypename::ParametricTypename(const ParametricTypename &typename_) :
            ParametricTypename{
                    typename_.m_constructorTypename->clone(),
                    cloneAll(typename_.m_parameterTypenames)} {
    }